

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

bool __thiscall
cmComputeLinkInformation::CheckImplicitDirItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  cmake *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  string file;
  string dir;
  LinkEntry fileEntry;
  allocator<char> local_139;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_138;
  string local_120;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  LinkEntry local_90;
  
  if (this->LinkTypeEnabled == true) {
    cmsys::SystemTools::GetFilenamePath(&local_b0,(string *)entry);
    bVar1 = ::cm::
            contains<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&this->ImplicitLinkDirs,&local_b0);
    if (bVar1) {
      cmsys::SystemTools::GetFilenameName(&local_120,(string *)entry);
      bVar1 = cmsys::RegularExpression::find
                        (&this->ExtractAnyLibraryName,local_120._M_dataplus._M_p);
      if ((bVar1) &&
         (PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0060(this->Target), 2 < PVar2 - NEW)) {
        if ((PVar2 == WARN) && (this->CMP0060Warn == true)) {
          cmStrCat<char_const(&)[23],std::__cxx11::string_const&>
                    ((string *)&local_90,(char (*) [23])"CMP0060-WARNING-GIVEN-",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)entry);
          bVar1 = cmake::GetPropertyAsBool(this->CMakeInstance,(string *)&local_90);
          if (!bVar1) {
            this_00 = this->CMakeInstance;
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"1",&local_139);
            cmake::SetProperty(this_00,(string *)&local_90,&local_100.Value);
            std::__cxx11::string::~string((string *)&local_100);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&this->CMP0060WarnItems,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)entry);
          }
          std::__cxx11::string::~string((string *)&local_90);
        }
        cmComputeLinkDepends::LinkEntry::LinkEntry(&local_90,entry);
        std::__cxx11::string::string((string *)&local_d0,(string *)&local_120);
        local_138.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_138.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_138);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                  (&local_100,&local_d0,(cmListFileBacktrace *)&local_138);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator=(&local_90.Item,&local_100);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                  (&local_100);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_138.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__cxx11::string::~string((string *)&local_d0);
        AddUserItem(this,&local_90,false);
        cmOrderDirectories::AddLinkLibrary
                  ((this->OrderLinkerSearchPath)._M_t.
                   super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
                   .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,(string *)entry)
        ;
        cmComputeLinkDepends::LinkEntry::~LinkEntry(&local_90);
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)&local_120);
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&local_b0);
    return bVar1;
  }
  return false;
}

Assistant:

bool cmComputeLinkInformation::CheckImplicitDirItem(LinkEntry const& entry)
{
  BT<std::string> const& item = entry.Item;

  // We only switch to a pathless item if the link type may be
  // enforced.  Fortunately only platforms that support link types
  // seem to have magic per-architecture implicit link directories.
  if (!this->LinkTypeEnabled) {
    return false;
  }

  // Check if this item is in an implicit link directory.
  std::string dir = cmSystemTools::GetFilenamePath(item.Value);
  if (!cm::contains(this->ImplicitLinkDirs, dir)) {
    // Only libraries in implicit link directories are converted to
    // pathless items.
    return false;
  }

  // Only apply the policy below if the library file is one that can
  // be found by the linker.
  std::string file = cmSystemTools::GetFilenameName(item.Value);
  if (!this->ExtractAnyLibraryName.find(file)) {
    return false;
  }

  // Check the policy for whether we should use the approach below.
  switch (this->Target->GetPolicyStatusCMP0060()) {
    case cmPolicies::WARN:
      if (this->CMP0060Warn) {
        // Print the warning at most once for this item.
        std::string const& wid =
          cmStrCat("CMP0060-WARNING-GIVEN-", item.Value);
        if (!this->CMakeInstance->GetPropertyAsBool(wid)) {
          this->CMakeInstance->SetProperty(wid, "1");
          this->CMP0060WarnItems.insert(item.Value);
        }
      }
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      break;
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::NEW:
      return false;
  }

  // Many system linkers support multiple architectures by
  // automatically selecting the implicit linker search path for the
  // current architecture.  If the library appears in an implicit link
  // directory then just report the file name without the directory
  // portion.  This will allow the system linker to locate the proper
  // library for the architecture at link time.
  LinkEntry fileEntry{ entry };
  fileEntry.Item = file;
  this->AddUserItem(fileEntry, false);

  // Make sure the link directory ordering will find the library.
  this->OrderLinkerSearchPath->AddLinkLibrary(item.Value);

  return true;
}